

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AllSyntax.h
# Opt level: O2

void __thiscall
slang::syntax::DataDeclarationSyntax::DataDeclarationSyntax
          (DataDeclarationSyntax *this,
          SyntaxList<slang::syntax::AttributeInstanceSyntax> *attributes,TokenList *modifiers,
          DataTypeSyntax *type,SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *declarators,
          Token semi)

{
  size_t sVar1;
  SyntaxNode *pSVar2;
  undefined4 uVar3;
  DeclaratorSyntax *pDVar4;
  SeparatedSyntaxList<slang::syntax::DeclaratorSyntax> *__range2;
  iterator __begin2;
  
  MemberSyntax::MemberSyntax(&this->super_MemberSyntax,DataDeclaration,attributes);
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (modifiers->super_SyntaxListBase).super_SyntaxNode.previewNode;
  uVar3 = *(undefined4 *)&(modifiers->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (modifiers->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.kind =
       (modifiers->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->modifiers).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->modifiers).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR___cxa_pure_virtual_0057ad48;
  (this->modifiers).super_SyntaxListBase.childCount = (modifiers->super_SyntaxListBase).childCount;
  sVar1 = (modifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_extent.
          _M_extent_value;
  (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_ptr =
       (modifiers->super_span<slang::parsing::Token,_18446744073709551615UL>)._M_ptr;
  (this->modifiers).super_span<slang::parsing::Token,_18446744073709551615UL>._M_extent.
  _M_extent_value = sVar1;
  (this->modifiers).super_SyntaxListBase._vptr_SyntaxListBase = (_func_int **)&PTR_getChild_0057ac88
  ;
  (this->type).ptr = type;
  uVar3 = *(undefined4 *)&(declarators->super_SyntaxListBase).super_SyntaxNode.field_0x4;
  pSVar2 = (declarators->super_SyntaxListBase).super_SyntaxNode.parent;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.kind =
       (declarators->super_SyntaxListBase).super_SyntaxNode.kind;
  *(undefined4 *)&(this->declarators).super_SyntaxListBase.super_SyntaxNode.field_0x4 = uVar3;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = pSVar2;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.previewNode =
       (declarators->super_SyntaxListBase).super_SyntaxNode.previewNode;
  (this->declarators).super_SyntaxListBase.childCount =
       (declarators->super_SyntaxListBase).childCount;
  (this->declarators).super_SyntaxListBase._vptr_SyntaxListBase =
       (_func_int **)&PTR_getChild_0057e588;
  sVar1 = (declarators->elements)._M_extent._M_extent_value;
  (this->declarators).elements._M_ptr = (declarators->elements)._M_ptr;
  (this->declarators).elements._M_extent._M_extent_value = sVar1;
  (this->semi).kind = semi.kind;
  (this->semi).field_0x2 = semi._2_1_;
  (this->semi).numFlags = (NumericTokenFlags)semi.numFlags.raw;
  (this->semi).rawLen = semi.rawLen;
  (this->semi).info = semi.info;
  (this->modifiers).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  (type->super_ExpressionSyntax).super_SyntaxNode.parent = (SyntaxNode *)this;
  (this->declarators).super_SyntaxListBase.super_SyntaxNode.parent = (SyntaxNode *)this;
  __begin2.index = 0;
  sVar1 = (this->declarators).elements._M_extent._M_extent_value;
  __begin2.list = &this->declarators;
  for (; (__begin2.list != &this->declarators || (__begin2.index != sVar1 + 1 >> 1));
      __begin2.index = __begin2.index + 1) {
    pDVar4 = SeparatedSyntaxList<slang::syntax::DeclaratorSyntax>::
             iterator_base<slang::syntax::DeclaratorSyntax_*>::dereference(&__begin2);
    (pDVar4->super_SyntaxNode).parent = (SyntaxNode *)this;
  }
  return;
}

Assistant:

DataDeclarationSyntax(const SyntaxList<AttributeInstanceSyntax>& attributes, const TokenList& modifiers, DataTypeSyntax& type, const SeparatedSyntaxList<DeclaratorSyntax>& declarators, Token semi) :
        MemberSyntax(SyntaxKind::DataDeclaration, attributes), modifiers(modifiers), type(&type), declarators(declarators), semi(semi) {
        this->modifiers.parent = this;
        this->type->parent = this;
        this->declarators.parent = this;
        for (auto child : this->declarators)
            child->parent = this;
    }